

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O2

void __thiscall
flatbuffers::swift::SwiftGenerator::GenTableReaderVectorFields(SwiftGenerator *this,FieldDef *field)

{
  CodeWriter *this_00;
  IdlNamer *this_01;
  StructDef *pSVar1;
  FieldDef *key_field;
  BaseType BVar2;
  size_t t;
  pointer ppFVar3;
  uint uVar4;
  char *pcVar5;
  char *__s;
  string *this_02;
  string sStack_318;
  string local_2f8;
  allocator<char> local_2d2;
  allocator<char> local_2d1;
  string local_2d0;
  string local_2b0;
  Type local_290;
  string local_270;
  string const_string;
  string local_230;
  string local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&const_string,"return o == 0 ? {{CONSTANT}} : ",(allocator<char> *)&local_290
            );
  local_290.base_type = (field->value).type.element;
  local_290.fixed_length = (field->value).type.fixed_length;
  local_290.element = BASE_TYPE_NONE;
  local_290.struct_def = (field->value).type.struct_def;
  local_290.enum_def = (field->value).type.enum_def;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_318,"SIZE",(allocator<char> *)&local_2d0);
  t = InlineSize(&local_290);
  NumToString<unsigned_long>(&local_2f8,t);
  this_00 = &this->code_;
  CodeWriter::SetValue(this_00,&sStack_318,&local_2f8);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::__cxx11::string::~string((string *)&sStack_318);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_318,"HAS_FIELDVAR",(allocator<char> *)&local_2b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2d0,"has",(allocator<char> *)&local_270);
  this_01 = &this->namer_;
  Namer::Variable<flatbuffers::FieldDef>(&local_2f8,&this_01->super_Namer,&local_2d0,field);
  CodeWriter::SetValue(this_00,&sStack_318,&local_2f8);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&sStack_318);
  GenOffset_abi_cxx11_(&local_2f8,this);
  std::operator+(&sStack_318,"{{ACCESS_TYPE}} var {{HAS_FIELDVAR}}: Bool { ",&local_2f8);
  std::operator+(&local_50,&sStack_318,"return o == 0 ? false : true }");
  CodeWriter::operator+=(this_00,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&sStack_318);
  std::__cxx11::string::~string((string *)&local_2f8);
  GenOffset_abi_cxx11_(&local_2f8,this);
  std::operator+(&sStack_318,"{{ACCESS_TYPE}} var {{FIELDVAR}}Count: Int32 { ",&local_2f8);
  std::operator+(&local_70,&sStack_318,"return o == 0 ? 0 : {{ACCESS}}.vector(count: o) }");
  CodeWriter::operator+=(this_00,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&sStack_318);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_318,"CONSTANT",(allocator<char> *)&local_2d0);
  pcVar5 = "nil";
  if (local_290.base_type - BASE_TYPE_UTYPE < 0xc) {
    pcVar5 = "0";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2f8,pcVar5,(allocator<char> *)&local_2b0);
  CodeWriter::SetValue(this_00,&sStack_318,&local_2f8);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::__cxx11::string::~string((string *)&sStack_318);
  if (local_290.base_type - BASE_TYPE_UTYPE < 0xc) {
    pcVar5 = "?";
    if (local_290.enum_def == (EnumDef *)0x0) {
      pcVar5 = "";
    }
    if (9 < local_290.base_type - BASE_TYPE_UTYPE) {
      pcVar5 = "";
    }
LAB_0021cf82:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2d0,pcVar5,(allocator<char> *)&local_270);
    anon_unknown_1::GenArrayMainBody(&local_2f8,&local_2d0);
    GenOffset_abi_cxx11_(&local_2b0,this);
    std::operator+(&sStack_318,&local_2f8,&local_2b0);
    std::operator+(&local_90,&sStack_318,"\\");
    CodeWriter::operator+=(this_00,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&sStack_318);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::__cxx11::string::~string((string *)&local_2f8);
    std::__cxx11::string::~string((string *)&local_2d0);
  }
  else {
    if (local_290.base_type != BASE_TYPE_UNION) {
      pcVar5 = "?";
      goto LAB_0021cf82;
    }
    GenOffset_abi_cxx11_(&local_2f8,this);
    std::operator+(&sStack_318,
                   "{{ACCESS_TYPE}} func {{FIELDVAR}}<T: FlatbuffersInitializable>(at index: Int32, type: T.Type) -> T? { "
                   ,&local_2f8);
    std::operator+(&local_b0,&sStack_318,"\\");
    CodeWriter::operator+=(this_00,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&sStack_318);
    std::__cxx11::string::~string((string *)&local_2f8);
    pcVar5 = "?";
  }
  if (local_290.base_type == BASE_TYPE_BOOL) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sStack_318,"CONSTANT",(allocator<char> *)&local_2d0);
    __s = "true";
    if ((field->value).offset == 0) {
      __s = "false";
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2f8,__s,(allocator<char> *)&local_2b0);
    CodeWriter::SetValue(this_00,&sStack_318,&local_2f8);
    std::__cxx11::string::~string((string *)&local_2f8);
    std::__cxx11::string::~string((string *)&sStack_318);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sStack_318,"VALUETYPE",(allocator<char> *)&local_2d0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2f8,"Bool",(allocator<char> *)&local_2b0);
    CodeWriter::SetValue(this_00,&sStack_318,&local_2f8);
    std::__cxx11::string::~string((string *)&local_2f8);
    std::__cxx11::string::~string((string *)&sStack_318);
  }
  uVar4 = local_290.base_type - BASE_TYPE_UTYPE;
  if (local_290.enum_def == (EnumDef *)0x0 || 9 < uVar4) {
    std::operator+(&local_d0,&const_string,"\\");
    CodeWriter::operator+=(this_00,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    uVar4 = local_290.base_type - BASE_TYPE_UTYPE;
    if (uVar4 < 0xc) goto LAB_0021d150;
    if (local_290.base_type != BASE_TYPE_STRING) {
      BVar2 = local_290.base_type;
      if (local_290.base_type == BASE_TYPE_STRUCT) {
        if (((field->value).type.struct_def)->fixed == true) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_150,
                     "{{ACCESS}}.directRead(of: {{VALUETYPE}}.self, offset: {{ACCESS}}.vector(at: o) + index * {{SIZE}}) }"
                     ,(allocator<char> *)&sStack_318);
          CodeWriter::operator+=(this_00,&local_150);
          std::__cxx11::string::~string((string *)&local_150);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&sStack_318,"FIELDMETHOD",(allocator<char> *)&local_2b0);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2d0,"mutable",(allocator<char> *)&local_270);
          (*(this_01->super_Namer)._vptr_Namer[3])(&local_2f8,this_01,&local_2d0);
          CodeWriter::SetValue(this_00,&sStack_318,&local_2f8);
          std::__cxx11::string::~string((string *)&local_2f8);
          std::__cxx11::string::~string((string *)&local_2d0);
          std::__cxx11::string::~string((string *)&sStack_318);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&sStack_318,"VALUETYPE",(allocator<char> *)&local_270);
          GenType_abi_cxx11_(&local_2d0,this,&(field->value).type,false);
          Mutable_abi_cxx11_(&local_2b0,this);
          std::operator+(&local_2f8,&local_2d0,&local_2b0);
          CodeWriter::SetValue(this_00,&sStack_318,&local_2f8);
          std::__cxx11::string::~string((string *)&local_2f8);
          std::__cxx11::string::~string((string *)&local_2b0);
          std::__cxx11::string::~string((string *)&local_2d0);
          std::__cxx11::string::~string((string *)&sStack_318);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b0,pcVar5,&local_2d1)
          ;
          anon_unknown_1::GenArrayMainBody(&local_2d0,&local_2b0);
          GenOffset_abi_cxx11_(&local_270,this);
          std::operator+(&local_2f8,&local_2d0,&local_270);
          std::operator+(&sStack_318,&local_2f8,&const_string);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1b0,"{{ACCESS}}.vector(at: o) + index * {{SIZE}}",&local_2d2);
          GenConstructor(&local_190,this,&local_1b0);
          std::operator+(&local_170,&sStack_318,&local_190);
          CodeWriter::operator+=(this_00,&local_170);
          std::__cxx11::string::~string((string *)&local_170);
          std::__cxx11::string::~string((string *)&local_190);
          std::__cxx11::string::~string((string *)&local_1b0);
          std::__cxx11::string::~string((string *)&sStack_318);
          std::__cxx11::string::~string((string *)&local_2f8);
          std::__cxx11::string::~string((string *)&local_270);
          std::__cxx11::string::~string((string *)&local_2d0);
          this_02 = &local_2b0;
          goto LAB_0021d5b5;
        }
        uVar4 = 0xe;
        BVar2 = BASE_TYPE_STRUCT;
      }
      goto LAB_0021d4b0;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d0,
               "{{ACCESS}}.directString(at: {{ACCESS}}.vector(at: o) + index * {{SIZE}}) }",
               (allocator<char> *)&sStack_318);
    CodeWriter::operator+=(this_00,&local_1d0);
    this_02 = &local_1d0;
  }
  else {
LAB_0021d150:
    BVar2 = local_290.base_type;
    if ((uVar4 < 10 && local_290.enum_def != (EnumDef *)0x0) ||
       ((field->value).type.base_type == BASE_TYPE_BOOL)) {
LAB_0021d4b0:
      if ((uVar4 < 10) && (local_290.enum_def != (EnumDef *)0x0)) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&sStack_318,"BASEVALUE",(allocator<char> *)&local_2d0);
        GenTypeBasic_abi_cxx11_(&local_2f8,this,&local_290,false);
        CodeWriter::SetValue(this_00,&sStack_318,&local_2f8);
        std::__cxx11::string::~string((string *)&local_2f8);
        std::__cxx11::string::~string((string *)&sStack_318);
        GenEnumDefaultValue_abi_cxx11_(&local_2f8,this,field);
        std::operator+(&sStack_318,"return o == 0 ? {{VALUETYPE}}",&local_2f8);
        std::operator+(&local_1f0,&sStack_318,
                       " : {{VALUETYPE}}(rawValue: {{ACCESS}}.directRead(of: {{BASEVALUE}}.self, offset: {{ACCESS}}.vector(at: o) + index * {{SIZE}})) }"
                      );
        CodeWriter::operator+=(this_00,&local_1f0);
        std::__cxx11::string::~string((string *)&local_1f0);
        std::__cxx11::string::~string((string *)&sStack_318);
        this_02 = &local_2f8;
      }
      else {
        if (BVar2 == BASE_TYPE_STRUCT) {
          if (((field->value).type.struct_def)->fixed == false) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&sStack_318,
                       "{{ACCESS}}.indirect({{ACCESS}}.vector(at: o) + index * {{SIZE}})",
                       (allocator<char> *)&local_2f8);
            GenConstructor(&local_230,this,&sStack_318);
            CodeWriter::operator+=(this_00,&local_230);
            std::__cxx11::string::~string((string *)&local_230);
            std::__cxx11::string::~string((string *)&sStack_318);
            pSVar1 = (field->value).type.struct_def;
            ppFVar3 = (pSVar1->fields).vec.
                      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            do {
              if (ppFVar3 ==
                  (pSVar1->fields).vec.
                  super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish) goto LAB_0021d5ba;
              key_field = *ppFVar3;
              ppFVar3 = ppFVar3 + 1;
            } while (key_field->key != true);
            GenByKeyFunctions(this,key_field);
          }
          goto LAB_0021d5ba;
        }
        if (BVar2 != BASE_TYPE_UNION) goto LAB_0021d5ba;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_210,
                   "{{ACCESS}}.directUnion({{ACCESS}}.vector(at: o) + index * {{SIZE}}) }",
                   (allocator<char> *)&sStack_318);
        CodeWriter::operator+=(this_00,&local_210);
        this_02 = &local_210;
      }
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f0,
                 "{{ACCESS}}.directRead(of: {{VALUETYPE}}.self, offset: {{ACCESS}}.vector(at: o) + index * {{SIZE}}) }"
                 ,(allocator<char> *)&sStack_318);
      CodeWriter::operator+=(this_00,&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_110,
                 "{{ACCESS_TYPE}} var {{FIELDVAR}}: [{{VALUETYPE}}] { return {{ACCESS}}.getVector(at: {{TABLEOFFSET}}.{{OFFSET}}.v) ?? [] }"
                 ,(allocator<char> *)&sStack_318);
      CodeWriter::operator+=(this_00,&local_110);
      std::__cxx11::string::~string((string *)&local_110);
      if ((((this->super_BaseGenerator).parser_)->opts).mutable_buffer != true) goto LAB_0021d5ba;
      GenMutateArray_abi_cxx11_(&local_130,this);
      CodeWriter::operator+=(this_00,&local_130);
      this_02 = &local_130;
    }
  }
LAB_0021d5b5:
  std::__cxx11::string::~string((string *)this_02);
LAB_0021d5ba:
  std::__cxx11::string::~string((string *)&const_string);
  return;
}

Assistant:

void GenTableReaderVectorFields(const FieldDef &field) {
    std::string const_string = "return o == 0 ? {{CONSTANT}} : ";
    const auto vectortype = field.value.type.VectorType();
    code_.SetValue("SIZE", NumToString(InlineSize(vectortype)));
    code_.SetValue("HAS_FIELDVAR", namer_.Variable("has", field));
    code_ += "{{ACCESS_TYPE}} var {{HAS_FIELDVAR}}: Bool { " + GenOffset() +
             "return o == 0 ? false : true }";
    code_ += "{{ACCESS_TYPE}} var {{FIELDVAR}}Count: Int32 { " + GenOffset() +
             "return o == 0 ? 0 : {{ACCESS}}.vector(count: o) }";
    code_.SetValue("CONSTANT", IsScalar(vectortype.base_type) ? "0" : "nil");
    const auto nullable =
        IsScalar(vectortype.base_type) && !IsEnum(vectortype) ? "" : "?";

    if (vectortype.base_type != BASE_TYPE_UNION) {
      code_ += GenArrayMainBody(nullable) + GenOffset() + "\\";
    } else {
      code_ +=
          "{{ACCESS_TYPE}} func {{FIELDVAR}}<T: FlatbuffersInitializable>(at "
          "index: "
          "Int32, type: T.Type) -> T? { " +
          GenOffset() + "\\";
    }

    if (IsBool(vectortype.base_type)) {
      code_.SetValue("CONSTANT", field.value.offset == 0 ? "false" : "true");
      code_.SetValue("VALUETYPE", "Bool");
    }

    if (!IsEnum(vectortype)) code_ += const_string + "\\";

    if (IsScalar(vectortype.base_type) && !IsEnum(vectortype) &&
        !IsBool(field.value.type.base_type)) {
      code_ +=
          "{{ACCESS}}.directRead(of: {{VALUETYPE}}.self, offset: "
          "{{ACCESS}}.vector(at: o) + index * {{SIZE}}) }";
      code_ +=
          "{{ACCESS_TYPE}} var {{FIELDVAR}}: [{{VALUETYPE}}] { return "
          "{{ACCESS}}.getVector(at: {{TABLEOFFSET}}.{{OFFSET}}.v) ?? [] }";
      if (parser_.opts.mutable_buffer) code_ += GenMutateArray();
      return;
    }

    if (vectortype.base_type == BASE_TYPE_STRUCT &&
        field.value.type.struct_def->fixed) {
      code_ +=
          "{{ACCESS}}.directRead(of: {{VALUETYPE}}.self, offset: "
          "{{ACCESS}}.vector(at: o) + index * {{SIZE}}) }";
      code_.SetValue("FIELDMETHOD", namer_.Method("mutable", field));
      code_.SetValue("VALUETYPE", GenType(field.value.type) + Mutable());
      code_ += GenArrayMainBody(nullable) + GenOffset() + const_string +
               GenConstructor("{{ACCESS}}.vector(at: o) + index * {{SIZE}}");

      return;
    }

    if (IsString(vectortype)) {
      code_ +=
          "{{ACCESS}}.directString(at: {{ACCESS}}.vector(at: o) + "
          "index * {{SIZE}}) }";
      return;
    }

    if (IsEnum(vectortype)) {
      code_.SetValue("BASEVALUE", GenTypeBasic(vectortype, false));
      code_ += "return o == 0 ? {{VALUETYPE}}" + GenEnumDefaultValue(field) +
               " : {{VALUETYPE}}(rawValue: {{ACCESS}}.directRead(of: "
               "{{BASEVALUE}}.self, offset: {{ACCESS}}.vector(at: o) + "
               "index * {{SIZE}})) }";
      return;
    }
    if (vectortype.base_type == BASE_TYPE_UNION) {
      code_ +=
          "{{ACCESS}}.directUnion({{ACCESS}}.vector(at: o) + "
          "index * {{SIZE}}) }";
      return;
    }

    if (vectortype.base_type == BASE_TYPE_STRUCT &&
        !field.value.type.struct_def->fixed) {
      code_ += GenConstructor(
          "{{ACCESS}}.indirect({{ACCESS}}.vector(at: o) + index * "
          "{{SIZE}})");
      const auto &sd = *field.value.type.struct_def;
      const auto &fields = sd.fields.vec;
      for (auto kit = fields.begin(); kit != fields.end(); ++kit) {
        const auto &key_field = **kit;
        if (key_field.key) {
          GenByKeyFunctions(key_field);
          break;
        }
      }
    }
  }